

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.c
# Opt level: O3

void * coll_deque_remove_at(coll_deque_t *deque,size_t index)

{
  ulong p;
  void *pvVar1;
  
  if ((deque == (coll_deque_t *)0x0) || (deque->len <= index)) {
    pvVar1 = (void *)0x0;
  }
  else {
    p = (deque->head + index) % deque->cap;
    pvVar1 = deque->data[p];
    coll_deque_release(deque,p,index < deque->len >> 1);
    deque->len = deque->len - 1;
  }
  return pvVar1;
}

Assistant:

void *coll_deque_remove_at(coll_deque_t *deque, size_t index) {
    if (!deque || index >= deque->len) {
        return NULL;
    }

    size_t pos = index_to_pos(deque, index);
    void *data = deque->data[pos];

    if (index < deque->len / 2) {
        coll_deque_release(deque, pos, true);
    } else {
        coll_deque_release(deque, pos, false);
    }
    --(deque->len);
    return data;
}